

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

Curl_hash_element * mk_hash_element(void *key,size_t key_len,void *p)

{
  Curl_hash_element *pCVar1;
  Curl_hash_element *he;
  void *p_local;
  size_t key_len_local;
  void *key_local;
  
  pCVar1 = (Curl_hash_element *)(*Curl_cmalloc)(key_len + 0x30);
  if (pCVar1 != (Curl_hash_element *)0x0) {
    memcpy(pCVar1->key,key,key_len);
    pCVar1->key_len = key_len;
    pCVar1->ptr = p;
  }
  return pCVar1;
}

Assistant:

static struct Curl_hash_element *
mk_hash_element(const void *key, size_t key_len, const void *p)
{
  /* allocate the struct plus memory after it to store the key */
  struct Curl_hash_element *he = malloc(sizeof(struct Curl_hash_element) +
                                        key_len);
  if(he) {
    /* copy the key */
    memcpy(he->key, key, key_len);
    he->key_len = key_len;
    he->ptr = (void *) p;
  }
  return he;
}